

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void spr_write_excp_vector(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  int iVar1;
  
  s = ctx->uc->tcg_ctx;
  iVar1 = -400;
  if ((((sprn & 0xfffffff0U) != 400) && (iVar1 = -0x1f0, 5 < sprn - 0x210U)) &&
     (iVar1 = -0x18a, 4 < sprn - 0x1b0U)) {
    printf("Trying to write an unknown exception vector %d %03x\n",(ulong)(uint)sprn,
           (ulong)(uint)sprn);
    gen_exception_err(ctx,0x60,0x22);
    return;
  }
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),0x132f0);
  tcg_gen_op3_ppc64(s,INDEX_op_and_i64,(TCGArg)ts,(TCGArg)ts,
                    (TCGArg)((long)&s->pool_cur + (long)cpu_gpr[gprn]));
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                    (ulong)(uint)(iVar1 + sprn) * 8 + 0x12fb8);
  tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                    (long)sprn * 8 + 0xb18);
  tcg_temp_free_internal_ppc64(s,ts);
  return;
}

Assistant:

static void spr_write_excp_vector(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int sprn_offs;

    if (sprn >= SPR_BOOKE_IVOR0 && sprn <= SPR_BOOKE_IVOR15) {
        sprn_offs = sprn - SPR_BOOKE_IVOR0;
    } else if (sprn >= SPR_BOOKE_IVOR32 && sprn <= SPR_BOOKE_IVOR37) {
        sprn_offs = sprn - SPR_BOOKE_IVOR32 + 32;
    } else if (sprn >= SPR_BOOKE_IVOR38 && sprn <= SPR_BOOKE_IVOR42) {
        sprn_offs = sprn - SPR_BOOKE_IVOR38 + 38;
    } else {
        printf("Trying to write an unknown exception vector %d %03x\n",
               sprn, sprn);
        gen_inval_exception(ctx, POWERPC_EXCP_PRIV_REG);
        return;
    }

    TCGv t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_ld_tl(tcg_ctx, t0, tcg_ctx->cpu_env, offsetof(CPUPPCState, ivor_mask));
    tcg_gen_and_tl(tcg_ctx, t0, t0, cpu_gpr[gprn]);
    tcg_gen_st_tl(tcg_ctx, t0, tcg_ctx->cpu_env, offsetof(CPUPPCState, excp_vectors[sprn_offs]));
    gen_store_spr(tcg_ctx, sprn, t0);
    tcg_temp_free(tcg_ctx, t0);
}